

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ProcessReturningSubqueries(ExprList *pEList,Table *pTab)

{
  long in_FS_OFFSET;
  Walker local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.pParse = (Parse *)0x0;
  local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_48.walkerDepth = 0;
  local_48.eCode = 0;
  local_48.mWFlags = 0;
  local_48.xExprCallback = sqlite3ExprWalkNoop;
  local_48.xSelectCallback = sqlite3ReturningSubqueryCorrelated;
  local_48.u.pTab = pTab;
  sqlite3WalkExprList(&local_48,pEList);
  if (local_48.eCode != 0) {
    local_48.xExprCallback = sqlite3ReturningSubqueryVarSelect;
    local_48.xSelectCallback = sqlite3SelectWalkNoop;
    sqlite3WalkExprList(&local_48,pEList);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3ProcessReturningSubqueries(
  ExprList *pEList,
  Table *pTab
){
  Walker w;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = sqlite3ExprWalkNoop;
  w.xSelectCallback = sqlite3ReturningSubqueryCorrelated;
  w.u.pTab = pTab;
  sqlite3WalkExprList(&w, pEList);
  if( w.eCode ){
    w.xExprCallback = sqlite3ReturningSubqueryVarSelect;
    w.xSelectCallback = sqlite3SelectWalkNoop;
    sqlite3WalkExprList(&w, pEList);
  }
}